

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O3

void __thiscall ipx::LpSolver::RunIPM(LpSolver *this)

{
  IPM ipm;
  string local_90;
  IPM local_70;
  
  IPM::IPM(&local_70,&this->control_);
  (this->info_).super_ipx_info.centring_tried = 0;
  (this->info_).super_ipx_info.centring_success = 0;
  if ((this->x_start_)._M_size == 0) {
    ComputeStartingPoint(this,&local_70);
    if ((this->info_).super_ipx_info.status_ipm != 0) {
      return;
    }
    RunInitialIPM(this,&local_70);
    if ((this->info_).super_ipx_info.status_ipm != 0) {
      return;
    }
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               " Using starting point provided by user. Skipping initial iterations.\n","");
    Control::hLog(&this->control_,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    Iterate::Initialize((this->iterate_)._M_t.
                        super___uniq_ptr_impl<ipx::Iterate,_std::default_delete<ipx::Iterate>_>._M_t
                        .super__Tuple_impl<0UL,_ipx::Iterate_*,_std::default_delete<ipx::Iterate>_>.
                        super__Head_base<0UL,_ipx::Iterate_*,_false>._M_head_impl,&this->x_start_,
                        &this->xl_start_,&this->xu_start_,&this->y_start_,&this->zl_start_,
                        &this->zu_start_);
  }
  BuildStartingBasis(this);
  if ((this->info_).super_ipx_info.centring_tried == 0 &&
      (this->info_).super_ipx_info.status_ipm == 0) {
    RunMainIPM(this,&local_70);
  }
  return;
}

Assistant:

void LpSolver::RunIPM() {
    IPM ipm(control_);
    info_.centring_tried = false;
    info_.centring_success = false;

    if (x_start_.size() != 0) {
      control_.hLog(" Using starting point provided by user. Skipping initial iterations.\n");
        iterate_->Initialize(x_start_, xl_start_, xu_start_,
                             y_start_, zl_start_, zu_start_);
    }
    else {
        ComputeStartingPoint(ipm);
        if (info_.status_ipm != IPX_STATUS_not_run)
            return;
        RunInitialIPM(ipm);
        if (info_.status_ipm != IPX_STATUS_not_run)
            return;
    }
    BuildStartingBasis();
    if (info_.status_ipm != IPX_STATUS_not_run || 
        info_.centring_tried)
        return;
    RunMainIPM(ipm);
}